

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::Brep> __thiscall
anurbs::Model::replace<anurbs::Brep>(Model *this,string *key,Pointer<anurbs::Brep> *data)

{
  Pointer<anurbs::Brep> *data_00;
  bool bVar1;
  ulong uVar2;
  invalid_argument *piVar3;
  mapped_type *__in;
  type *ptVar4;
  shared_ptr<anurbs::Brep> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar5;
  shared_ptr<anurbs::Brep> local_50;
  Pointer<anurbs::Brep> *local_40;
  size_t index;
  Pointer<anurbs::Brep> *data_local;
  string *key_local;
  Model *this_local;
  
  data_local = data;
  key_local = key;
  this_local = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Key is empty");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::operator==(in_RCX,(nullptr_t)0x0);
  if (!bVar1) {
    __in = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)&key[1].field_2,(key_type *)data_local);
    ptVar4 = std::get<0ul,unsigned_long,unsigned_long>(__in);
    data_00 = (Pointer<anurbs::Brep> *)*ptVar4;
    local_40 = data_00;
    std::shared_ptr<anurbs::Brep>::shared_ptr(&local_50,in_RCX);
    replace<anurbs::Brep>(this,(size_t)key,data_00);
    std::shared_ptr<anurbs::Brep>::~shared_ptr(&local_50);
    RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (Ref<anurbs::Brep>)
           RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Data is null");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Ref<TData> replace(const std::string& key, Pointer<TData> data)
    {
        if (key.empty()) {
            throw std::invalid_argument("Key is empty");
        }
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        const size_t index = std::get<0>(m_key_map.at(key));

        return replace(index, data);
    }